

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O0

int Io_WriteMoPlaOne(FILE *pFile,Abc_Ntk_t *pNtk)

{
  int iVar1;
  DdManager *dd_00;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj_00;
  void *Entry;
  DdNode *n;
  int local_4c;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vFuncsGlob;
  DdNode *bFunc;
  DdManager *dd;
  int fVerbose;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWritePla.c"
                  ,0x188,"int Io_WriteMoPlaOne(FILE *, Abc_Ntk_t *)");
  }
  dd_00 = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,0);
  if (dd_00 == (DdManager *)0x0) {
    pFile_local._4_4_ = 0;
  }
  else {
    iVar1 = Abc_NtkCoNum(pNtk);
    p = Vec_PtrAlloc(iVar1);
    for (local_4c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_4c < iVar1; local_4c = local_4c + 1) {
      pObj_00 = Abc_NtkCo(pNtk,local_4c);
      Entry = Abc_ObjGlobalBdd(pObj_00);
      Vec_PtrPush(p,Entry);
    }
    Io_WriteMoPlaOneIntMinterms(pFile,pNtk,dd_00,p);
    Abc_NtkFreeGlobalBdds(pNtk,0);
    for (local_4c = 0; iVar1 = Vec_PtrSize(p), local_4c < iVar1; local_4c = local_4c + 1) {
      n = (DdNode *)Vec_PtrEntry(p,local_4c);
      Cudd_RecursiveDeref(dd_00,n);
    }
    Vec_PtrFree(p);
    Extra_StopManager(dd_00);
    pFile_local._4_4_ = 1;
  }
  return pFile_local._4_4_;
}

Assistant:

int Io_WriteMoPlaOne( FILE * pFile, Abc_Ntk_t * pNtk )
{
    int fVerbose = 0;
    DdManager * dd;
    DdNode * bFunc;
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, 10000000, 1, 1, 0, fVerbose );
    if ( dd == NULL )
        return 0;
    if ( fVerbose )
        printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );

    // consider minterms
    Io_WriteMoPlaOneIntMinterms( pFile, pNtk, dd, vFuncsGlob );
    Abc_NtkFreeGlobalBdds( pNtk, 0 );

    // cleanup
    Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
        Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vFuncsGlob );
    Extra_StopManager( dd );
    return 1;
}